

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo5.cpp
# Opt level: O0

int64_t primecount::pi_lmo5(int64_t x,bool is_print)

{
  string_view_t str;
  string_view_t str_00;
  string_view_t str_01;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  size_t sVar1;
  long y_00;
  Vector<int,_std::allocator<int>_> *this;
  int64_t iVar2;
  byte in_SIL;
  long in_RDI;
  int64_t sum;
  int64_t phi;
  int64_t s2;
  int64_t s1;
  int64_t p2;
  int64_t pi_y;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  type primes;
  int64_t c;
  int64_t z;
  int64_t y;
  int64_t x13;
  double alpha;
  int threads;
  Vector<int,_std::allocator<int>_> *in_stack_00000160;
  Vector<int,_std::allocator<int>_> *in_stack_00000168;
  int64_t in_stack_00000170;
  int64_t in_stack_00000178;
  int64_t in_stack_00000180;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  char *in_stack_fffffffffffffea8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffee0;
  int threads_00;
  int64_t in_stack_fffffffffffffee8;
  int64_t in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined1 is_print_00;
  undefined4 uVar3;
  int in_stack_fffffffffffffefc;
  undefined4 uVar4;
  int64_t in_stack_ffffffffffffff00;
  Vector<int,_std::allocator<int>_> *pVVar5;
  undefined8 in_stack_ffffffffffffff08;
  int64_t in_stack_ffffffffffffff10;
  Vector<int,_std::allocator<int>_> local_b0;
  long local_98;
  long local_90;
  uint64_t local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_30;
  double local_20;
  undefined4 local_18;
  byte local_11;
  long local_10;
  long local_8;
  
  threads_00 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  local_11 = in_SIL & 1;
  if (in_RDI < 2) {
    local_8 = 0;
  }
  else {
    local_18 = 1;
    local_30 = in_RDI >> 0x3f;
    x_00._8_4_ = in_stack_fffffffffffffef8;
    x_00._0_8_ = in_stack_fffffffffffffef0;
    x_00._12_4_ = in_stack_fffffffffffffefc;
    local_10 = in_RDI;
    local_20 = get_alpha_lmo((maxint_t)x_00);
    local_40 = (anonymous_namespace)::iroot<3,long>((long)in_stack_fffffffffffffeb0);
    local_48 = (long)((double)local_40 * local_20);
    local_50 = local_10 / local_48;
    local_58 = PhiTiny::get_c(CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    if ((local_11 & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      str._M_str = (char *)in_stack_fffffffffffffeb0;
      str._M_len = (size_t)in_stack_fffffffffffffea8;
      print(str);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      str_00._M_str = (char *)in_stack_fffffffffffffeb0;
      str_00._M_len = (size_t)in_stack_fffffffffffffea8;
      print(str_00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      str_01._M_str = (char *)in_stack_fffffffffffffeb0;
      str_01._M_len = (size_t)in_stack_fffffffffffffea8;
      print(str_01);
      local_90 = local_10 >> 0x3f;
      local_98 = local_10;
      x_01._8_8_ = in_stack_ffffffffffffff08;
      x_01._0_8_ = in_stack_ffffffffffffff00;
      print((maxint_t)x_01,CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
            in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,threads_00);
    }
    generate_primes<int>(CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    generate_lpf(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    generate_moebius(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    is_print_00 = (undefined1)((uint)in_stack_fffffffffffffef8 >> 0x18);
    sVar1 = Vector<int,_std::allocator<int>_>::size(&local_b0);
    y_00 = sVar1 - 1;
    primecount::is_print();
    this = (Vector<int,_std::allocator<int>_> *)
           P2(in_stack_ffffffffffffff10,y_00,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
              (bool)is_print_00);
    pVVar5 = this;
    iVar2 = S1(in_stack_ffffffffffffff10,y_00,(int64_t)this,in_stack_fffffffffffffefc,
               (bool)is_print_00);
    uVar3 = (undefined4)iVar2;
    uVar4 = (undefined4)((ulong)iVar2 >> 0x20);
    iVar2 = anon_unknown.dwarf_79f40::S2
                      (in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168,
                       in_stack_00000160,(Vector<int,_std::allocator<int>_> *)x,is_print);
    local_8 = (CONCAT44(uVar4,uVar3) + iVar2 + y_00 + -1) - (long)pVVar5;
    Vector<int,_std::allocator<int>_>::~Vector(this);
    Vector<int,_std::allocator<int>_>::~Vector(this);
    Vector<int,_std::allocator<int>_>::~Vector(this);
  }
  return local_8;
}

Assistant:

int64_t pi_lmo5(int64_t x, bool is_print)
{
  if (x < 2)
    return 0;

  int threads = 1;
  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t z = x / y;
  int64_t c = PhiTiny::get_c(y);

  if (is_print)
  {
    print("");
    print("=== pi_lmo5(x) ===");
    print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
    print(x, y, z, c, threads);
  }

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);
  int64_t s1 = S1(x, y, c, threads, is_print);
  int64_t s2 = S2(x, y, c, primes, lpf, mu, is_print);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}